

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O2

bool __thiscall BackwardPass::DoTrackCompoundedIntOverflow(BackwardPass *this)

{
  bool bVar1;
  uint sourceContextId;
  uint functionId;
  
  sourceContextId = Func::GetSourceContextId(this->func);
  functionId = Func::GetLocalFunctionId(this->func);
  bVar1 = Js::Phases::IsEnabled
                    ((Phases *)&DAT_01441eb0,TrackCompoundedIntOverflowPhase,sourceContextId,
                     functionId);
  if ((!bVar1) && (bVar1 = DoTrackIntOverflow(this), bVar1)) {
    bVar1 = Func::IsTrackCompoundedIntOverflowDisabled(this->func);
    return !bVar1;
  }
  return false;
}

Assistant:

bool
BackwardPass::DoTrackCompoundedIntOverflow() const
{
    return
        !PHASE_OFF(Js::TrackCompoundedIntOverflowPhase, func) &&
        DoTrackIntOverflow() && !func->IsTrackCompoundedIntOverflowDisabled();
}